

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O2

psa_status_t
psa_copy_key(psa_key_handle_t source_handle,psa_key_attributes_t *specified_attributes,
            psa_key_handle_t *target_handle)

{
  ushort uVar1;
  psa_algorithm_t alg2;
  uint alg2_00;
  psa_key_slot_t *slot;
  psa_algorithm_t pVar2;
  psa_algorithm_t pVar3;
  int iVar4;
  psa_algorithm_t pVar5;
  psa_algorithm_t pVar6;
  uint8_t *data;
  psa_key_attributes_t *ppVar7;
  psa_se_drv_table_entry_t **in_R8;
  psa_key_attributes_t *driver_00;
  psa_key_slot_t *slot_00;
  psa_key_slot_t *target_slot;
  psa_se_drv_table_entry_t *driver;
  psa_key_slot_t *source_slot;
  size_t local_70;
  psa_key_attributes_t actual_attributes;
  
  driver_00 = (psa_key_attributes_t *)&source_slot;
  source_slot = (psa_key_slot_t *)0x0;
  target_slot = (psa_key_slot_t *)0x0;
  actual_attributes.core.type = (specified_attributes->core).type;
  actual_attributes.core.bits = (specified_attributes->core).bits;
  actual_attributes.core.lifetime = (specified_attributes->core).lifetime;
  actual_attributes.core.id = (specified_attributes->core).id;
  actual_attributes.core.policy.usage = (specified_attributes->core).policy.usage;
  actual_attributes.core.policy.alg = (specified_attributes->core).policy.alg;
  actual_attributes.core.policy.alg2 = (specified_attributes->core).policy.alg2;
  actual_attributes._24_8_ = *(undefined8 *)&(specified_attributes->core).flags;
  actual_attributes.domain_parameters = specified_attributes->domain_parameters;
  actual_attributes.domain_parameters_size = specified_attributes->domain_parameters_size;
  driver = (psa_se_drv_table_entry_t *)0x0;
  slot_00 = (psa_key_slot_t *)0x0;
  iVar4 = psa_get_key_from_slot(source_handle,(psa_key_slot_t **)driver_00,2,0);
  slot = source_slot;
  if (iVar4 != 0) goto LAB_0010f32a;
  iVar4 = psa_validate_optional_attributes(source_slot,specified_attributes);
  if (iVar4 == 0) {
    pVar2 = actual_attributes.core.policy.alg;
    alg2 = (slot->attr).policy.alg;
    pVar5 = psa_key_policy_algorithm_intersection(actual_attributes.core.policy.alg,alg2);
    pVar3 = actual_attributes.core.policy.alg2;
    alg2_00 = (slot->attr).policy.alg2;
    specified_attributes = (psa_key_attributes_t *)(ulong)alg2_00;
    pVar6 = psa_key_policy_algorithm_intersection(actual_attributes.core.policy.alg2,alg2_00);
    iVar4 = -0x87;
    if ((((alg2 == 0) || (pVar2 == 0)) || (pVar5 != 0)) &&
       (((alg2_00 == 0 || (pVar3 == 0)) || (pVar6 != 0)))) {
      actual_attributes.core.policy.usage =
           actual_attributes.core.policy.usage & (slot->attr).policy.usage;
      actual_attributes.core.policy.alg2 = pVar6;
      actual_attributes.core.policy.alg = pVar5;
      driver_00 = (psa_key_attributes_t *)target_handle;
      iVar4 = psa_start_key_creation
                        ((psa_key_creation_method_t)&actual_attributes,
                         (psa_key_attributes_t *)target_handle,(psa_key_handle_t *)&target_slot,
                         (psa_key_slot_t **)&driver,in_R8);
      slot_00 = target_slot;
      if (iVar4 != 0) goto LAB_0010f32a;
      uVar1 = (slot->attr).type;
      if (((uVar1 & 0x7000) == 0x2000) || ((uVar1 & 0x7000) == 0x1000)) {
LAB_0010f3a3:
        driver_00 = (psa_key_attributes_t *)(ulong)((slot->attr).bits + 7 >> 3);
      }
      else if (uVar1 == 0x4001) {
        driver_00 = (psa_key_attributes_t *)((ulong)((slot->attr).bits >> 3) + 0x10);
      }
      else if (uVar1 == 0x4002) {
        driver_00 = (psa_key_attributes_t *)((ulong)((slot->attr).bits >> 3) * 3 + 0x4a);
      }
      else if (uVar1 == 0x7002) {
        driver_00 = (psa_key_attributes_t *)((ulong)((slot->attr).bits >> 3) * 3 + 0x5a);
      }
      else if (uVar1 == 0x7001) {
        driver_00 = (psa_key_attributes_t *)((ulong)(((slot->attr).bits >> 1) + 1 >> 3) * 9 + 0x3b);
      }
      else if ((uVar1 & 0xff00) == 0x4100) {
        driver_00 = (psa_key_attributes_t *)((ulong)((slot->attr).bits + 7 >> 2) | 1);
      }
      else {
        if ((uVar1 & 0xff00) == 0x7100) goto LAB_0010f3a3;
        driver_00 = (psa_key_attributes_t *)0x0;
      }
      ppVar7 = driver_00;
      data = (uint8_t *)calloc(1,(size_t)driver_00);
      if (data == (uint8_t *)0x0) {
        iVar4 = -0x8d;
        driver_00 = ppVar7;
      }
      else {
        iVar4 = psa_internal_export_key(slot,data,(size_t)driver_00,&local_70,0);
        if (iVar4 == 0) {
          (slot_00->attr).type = (slot->attr).type;
          iVar4 = psa_import_key_into_slot(slot_00,data,local_70);
        }
        mbedtls_platform_zeroize(data,(size_t)driver_00);
        free(data);
        slot_00 = target_slot;
        if ((iVar4 == 0) &&
           (iVar4 = psa_finish_key_creation(target_slot,(psa_se_drv_table_entry_t *)driver_00),
           slot_00 = target_slot, iVar4 == 0)) {
          return 0;
        }
      }
      goto LAB_0010f32a;
    }
  }
  driver_00 = specified_attributes;
  slot_00 = (psa_key_slot_t *)0x0;
LAB_0010f32a:
  psa_fail_key_creation(slot_00,(psa_se_drv_table_entry_t *)driver_00);
  *target_handle = 0;
  return iVar4;
}

Assistant:

psa_status_t psa_copy_key( psa_key_handle_t source_handle,
                           const psa_key_attributes_t *specified_attributes,
                           psa_key_handle_t *target_handle )
{
    psa_status_t status;
    psa_key_slot_t *source_slot = NULL;
    psa_key_slot_t *target_slot = NULL;
    psa_key_attributes_t actual_attributes = *specified_attributes;
    psa_se_drv_table_entry_t *driver = NULL;

    status = psa_get_transparent_key( source_handle, &source_slot,
                                      PSA_KEY_USAGE_COPY, 0 );
    if( status != PSA_SUCCESS )
        goto exit;

    status = psa_validate_optional_attributes( source_slot,
                                               specified_attributes );
    if( status != PSA_SUCCESS )
        goto exit;

    status = psa_restrict_key_policy( &actual_attributes.core.policy,
                                      &source_slot->attr.policy );
    if( status != PSA_SUCCESS )
        goto exit;

    status = psa_start_key_creation( PSA_KEY_CREATION_COPY,
                                     &actual_attributes,
                                     target_handle, &target_slot, &driver );
    if( status != PSA_SUCCESS )
        goto exit;

#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
    if( driver != NULL )
    {
        /* Copying to a secure element is not implemented yet. */
        status = PSA_ERROR_NOT_SUPPORTED;
        goto exit;
    }
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */

    status = psa_copy_key_material( source_slot, target_slot );
    if( status != PSA_SUCCESS )
        goto exit;

    status = psa_finish_key_creation( target_slot, driver );
exit:
    if( status != PSA_SUCCESS )
    {
        psa_fail_key_creation( target_slot, driver );
        *target_handle = 0;
    }
    return( status );
}